

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# room-math.h
# Opt level: O0

Query * __thiscall RoomMath::generate(RoomMath *this)

{
  bool bVar1;
  type *ptVar2;
  type *ptVar3;
  long in_RSI;
  Query *in_RDI;
  float fVar4;
  type *answer;
  type *text;
  int b;
  int a;
  float d;
  float dy;
  float dx;
  Query *query;
  iterator __end2;
  iterator __begin2;
  vector<Query,_std::allocator<Query>_> *__range2;
  float curd;
  float cy;
  float cx;
  int i;
  float y;
  float x;
  float dist;
  vector<Query,_std::allocator<Query>_> *in_stack_ffffffffffffff08;
  __normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_> *in_stack_ffffffffffffff10
  ;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  Query *this_01;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  int local_64;
  int local_60;
  float local_5c;
  float local_58;
  float local_54;
  reference local_50;
  Query *local_48;
  __normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_> local_40;
  long local_38;
  float local_2c;
  float local_28;
  float local_24;
  int local_20;
  float local_1c;
  float local_18;
  float local_14;
  
  local_14 = 0.0;
  local_18 = 0.0;
  local_1c = 0.0;
  this_01 = in_RDI;
  for (local_20 = 0; local_20 < 0x20; local_20 = local_20 + 1) {
    fVar4 = anon_unknown.dwarf_1322b::frand();
    local_24 = fVar4 * 1.5 + -0.75;
    fVar4 = anon_unknown.dwarf_1322b::frand();
    local_28 = fVar4 * 1.5 + -0.75;
    local_2c = 1e+06;
    local_38 = in_RSI + 0x70;
    local_40._M_current =
         (Query *)std::vector<Query,_std::allocator<Query>_>::begin(in_stack_ffffffffffffff08);
    local_48 = (Query *)std::vector<Query,_std::allocator<Query>_>::end(in_stack_ffffffffffffff08);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffff10,
                         (__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_> *)
                         in_stack_ffffffffffffff08);
      if (!bVar1) break;
      local_50 = __gnu_cxx::__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                 ::operator*(&local_40);
      local_54 = local_24 - local_50->x;
      local_58 = local_28 - local_50->y;
      local_5c = local_54 * local_54 + local_58 * local_58;
      if (local_5c < local_2c) {
        local_2c = local_5c;
      }
      __gnu_cxx::__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>::operator++
                (&local_40);
    }
    if (local_14 < local_2c) {
      local_14 = local_2c;
      local_18 = local_24;
      local_1c = local_28;
    }
  }
  local_60 = rand();
  local_60 = local_60 % 100;
  local_64 = rand();
  local_64 = local_64 % 100;
  this_00 = &local_a8;
  std::
  function<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(int,_int)>
  ::operator()((function<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(int,_int)>
                *)this_01,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  ptVar2 = std::get<0ul,std::__cxx11::string,std::__cxx11::string>
                     ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x11f12c);
  ptVar3 = std::get<1ul,std::__cxx11::string,std::__cxx11::string>
                     ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x11f13b);
  in_RDI->x = local_18;
  in_RDI->y = local_1c;
  in_RDI->clientId = 0;
  in_RDI->tGuessed_s = 0.0;
  std::__cxx11::string::string((string *)&in_RDI->text,(string *)ptVar2);
  std::__cxx11::string::string((string *)&in_RDI->answer,(string *)ptVar3);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(this_00);
  return this_01;
}

Assistant:

virtual Query generate() override {
        float dist = 0.0f;

        float x = 0.0f;
        float y = 0.0f;

        for (int i = 0; i < 32; ++i) {
            float cx = 1.50f*frand() - 0.75f;
            float cy = 1.50f*frand() - 0.75f;

            float curd = 1e6;
            for (auto & query : pool) {
                float dx = cx - query.x;
                float dy = cy - query.y;

                float d = dx*dx + dy*dy;
                if (d < curd) {
                    curd = d;
                }
            }

            if (curd > dist) {
                dist = curd;
                x = cx;
                y = cy;
            }
        }

        int a = rand()%100;
        int b = rand()%100;

        auto [ text, answer ] = getQuery(a, b);

        return { x, y, 0, 0.0f, text, answer };
    }